

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O0

bool __thiscall
wasm::SimplifyLocals<true,_false,_true>::canSink
          (SimplifyLocals<true,_false,_true> *this,LocalSet *set)

{
  bool bVar1;
  Module *pMVar2;
  PassOptions *passOptions;
  reference pvVar3;
  byte local_1a9;
  EffectAnalyzer local_198;
  FeatureSet local_24;
  LocalSet *pLStack_20;
  FeatureSet features;
  LocalSet *set_local;
  SimplifyLocals<true,_false,_true> *this_local;
  
  pLStack_20 = set;
  bVar1 = LocalSet::isTee(set);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    pMVar2 = Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
             ::getModule((Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                          *)&(this->
                             super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
                             ).
                             super_LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                        );
    local_24.features = (pMVar2->features).features;
    bVar1 = FeatureSet::hasExceptionHandling(&local_24);
    local_1a9 = 0;
    if (bVar1) {
      passOptions = Pass::getPassOptions((Pass *)this);
      pMVar2 = Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
               ::getModule((Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                            *)&(this->
                               super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
                               ).
                               super_LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                          );
      EffectAnalyzer::EffectAnalyzer(&local_198,passOptions,pMVar2,pLStack_20->value);
      EffectAnalyzer::~EffectAnalyzer(&local_198);
      local_1a9 = local_198.danglingPop;
    }
    if ((local_1a9 & 1) == 0) {
      if (((this->firstCycle & 1U) == 0) ||
         (pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&(this->getCounter).num,(ulong)pLStack_20->index), *pvVar3 < 2)) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool canSink(LocalSet* set) {
    // we can never move a tee
    if (set->isTee()) {
      return false;
    }
    // We cannot move expressions containing pops that are not enclosed in
    // 'catch', because 'pop' should follow right after 'catch'.
    FeatureSet features = this->getModule()->features;
    if (features.hasExceptionHandling() &&
        EffectAnalyzer(this->getPassOptions(), *this->getModule(), set->value)
          .danglingPop) {
      return false;
    }
    // if in the first cycle, or not allowing tees, then we cannot sink if >1
    // use as that would make a tee
    if ((firstCycle || !allowTee) && getCounter.num[set->index] > 1) {
      return false;
    }
    return true;
  }